

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

SPIRType * __thiscall spirv_cross::Compiler::get_type_from_variable(Compiler *this,VariableID id)

{
  SPIRVariable *pSVar1;
  SPIRType *pSVar2;
  
  pSVar1 = get<spirv_cross::SPIRVariable>(this,id.id);
  pSVar2 = get<spirv_cross::SPIRType>(this,*(uint32_t *)&(pSVar1->super_IVariant).field_0xc);
  return pSVar2;
}

Assistant:

const SPIRType &Compiler::get_type_from_variable(VariableID id) const
{
	return get<SPIRType>(get<SPIRVariable>(id).basetype);
}